

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.hpp
# Opt level: O2

shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* boost::xpressive::detail::
  get_invalid_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>(void)

{
  int iVar1;
  
  if (get_invalid_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>()::
      invalid_xpr_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&get_invalid_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>()
                                 ::invalid_xpr_abi_cxx11_);
    if (iVar1 != 0) {
      get_invalid_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>()::
      invalid_xpr_abi_cxx11_.
      super_matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._vptr_matchable = (_func_int **)&PTR__matchable_00186578;
      LOCK();
      get_invalid_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>()::
      invalid_xpr_abi_cxx11_.
      super_matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      .count_.value_ = (atomic_count)1;
      UNLOCK();
      __cxa_guard_release(&get_invalid_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>()
                           ::invalid_xpr_abi_cxx11_);
    }
  }
  if (get_invalid_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>()::
      invalid_ptr_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&get_invalid_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>()
                                 ::invalid_ptr_abi_cxx11_);
    if (iVar1 != 0) {
      get_invalid_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>()::
      invalid_ptr_abi_cxx11_.px =
           &get_invalid_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>()
            ::invalid_xpr_abi_cxx11_.
            super_matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ;
      LOCK();
      get_invalid_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>()::
      invalid_xpr_abi_cxx11_.
      super_matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      .count_.value_ =
           (atomic_count)
           ((int)get_invalid_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>()
                 ::invalid_xpr_abi_cxx11_.
                 super_matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 .count_.value_ + 1);
      UNLOCK();
      __cxa_atexit(intrusive_ptr<const_boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::~intrusive_ptr,
                   &get_invalid_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>()
                    ::invalid_ptr_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&get_invalid_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>()
                           ::invalid_ptr_abi_cxx11_);
    }
  }
  if (get_invalid_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>()::
      invalid_matchable_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&get_invalid_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>()
                                 ::invalid_matchable_abi_cxx11_);
    if (iVar1 != 0) {
      get_invalid_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>()::
      invalid_matchable_abi_cxx11_.xpr_.px =
           (matchable_ptr)
           (matchable_ptr)
           get_invalid_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>()::
           invalid_ptr_abi_cxx11_.px;
      if (get_invalid_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>()::
          invalid_ptr_abi_cxx11_.px !=
          (matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x0) {
        LOCK();
        ((get_invalid_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>()::
          invalid_ptr_abi_cxx11_.px)->
        super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ).count_.value_ =
             ((get_invalid_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>()
               ::invalid_ptr_abi_cxx11_.px)->
             super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ).count_.value_ + 1;
        UNLOCK();
      }
      __cxa_atexit(shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::~shared_matchable,
                   &get_invalid_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>()
                    ::invalid_matchable_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&get_invalid_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>()
                           ::invalid_matchable_abi_cxx11_);
    }
  }
  return &get_invalid_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>()::
          invalid_matchable_abi_cxx11_;
}

Assistant:

inline shared_matchable<BidiIter> const &get_invalid_xpression()
{
    static invalid_xpression<BidiIter> const invalid_xpr;
    static intrusive_ptr<matchable_ex<BidiIter> const> const invalid_ptr(&invalid_xpr);
    static shared_matchable<BidiIter> const invalid_matchable(invalid_ptr);
    return invalid_matchable;
}